

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_sptfqmr_serial.c
# Opt level: O2

int check_vector(N_Vector X,N_Vector Y,realtype tol)

{
  realtype *prVar1;
  realtype *prVar2;
  sunindextype sVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  
  prVar1 = N_VGetArrayPointer(X);
  prVar2 = N_VGetArrayPointer(Y);
  lVar4 = 0;
  sVar3 = problem_size;
  if (problem_size < 1) {
    sVar3 = lVar4;
  }
  iVar5 = 0;
  for (; sVar3 != lVar4; lVar4 = lVar4 + 1) {
    dVar7 = prVar1[lVar4];
    uVar6 = 1;
    if (!NAN(dVar7)) {
      uVar6 = (uint)(ABS(dVar7) * tol * 5.0 < ABS(dVar7 - prVar2[lVar4]));
    }
    iVar5 = iVar5 + uVar6;
  }
  if (iVar5 == 0) {
    iVar5 = 0;
  }
  else {
    dVar7 = 0.0;
    for (lVar4 = 0; sVar3 != lVar4; lVar4 = lVar4 + 1) {
      dVar8 = ABS((prVar1[lVar4] - prVar2[lVar4]) / prVar1[lVar4]);
      if (dVar8 <= dVar7) {
        dVar8 = dVar7;
      }
      dVar7 = dVar8;
    }
    printf("check err failure: maxerr = %g (tol = %g)\n");
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int check_vector(N_Vector X, N_Vector Y, realtype tol)
{
  int failure = 0;
  sunindextype i;
  realtype *Xdata, *Ydata, maxerr;
  
  Xdata = N_VGetArrayPointer(X);
  Ydata = N_VGetArrayPointer(Y);
  
  /* check vector data */
  for(i=0; i<problem_size; i++)
    failure += FNEQ(Xdata[i], Ydata[i], FIVE*tol*SUNRabs(Xdata[i]));

  if (failure > ZERO) {
    maxerr = ZERO;
    for(i=0; i < problem_size; i++)
      maxerr = SUNMAX(SUNRabs(Xdata[i]-Ydata[i])/SUNRabs(Xdata[i]), maxerr);
    printf("check err failure: maxerr = %g (tol = %g)\n",
	   maxerr, FIVE*tol);
    return(1);
  }
  else
    return(0);
}